

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseUnnamedTypeName(Db *this,NameState *param_1)

{
  bool bVar1;
  undefined1 local_b8 [8];
  StringView Count_1;
  Node **local_a0;
  Node *local_90;
  Node *P;
  size_t ParamsBegin;
  undefined1 local_70 [8];
  SwapAndRestore<bool> SwapParams;
  NodeArray Params;
  undefined1 local_40 [8];
  StringView Count;
  NameState *param_1_local;
  Db *this_local;
  
  StringView::StringView((StringView *)&Count.Last,"Ut");
  bVar1 = consumeIf(this,stack0xffffffffffffffd0);
  if (bVar1) {
    _local_40 = parseNumber(this,false);
    bVar1 = consumeIf(this,'_');
    if (bVar1) {
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::UnnamedTypeName,StringView&>
                                   ((Db *)this,(StringView *)local_40);
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  else {
    StringView::StringView((StringView *)&Params.NumElements,"Ul");
    bVar1 = consumeIf(this,stack0xffffffffffffffb0);
    if (bVar1) {
      NodeArray::NodeArray((NodeArray *)&SwapParams.OriginalValue);
      SwapAndRestore<bool>::SwapAndRestore
                ((SwapAndRestore<bool> *)local_70,&this->ParsingLambdaParams,true);
      StringView::StringView((StringView *)&ParamsBegin,"vE");
      bVar1 = consumeIf(this,_ParamsBegin);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        P = (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
        do {
          local_90 = parseType(this);
          if (local_90 == (Node *)0x0) {
            this_local = (Db *)0x0;
            goto LAB_002657ee;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_90);
          bVar1 = consumeIf(this,'E');
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        join_0x00000010_0x00000000_ = popTrailingNodeArray(this,(size_t)P);
        SwapParams._8_8_ = Count_1.Last;
        Params.Elements = local_a0;
      }
      _local_b8 = parseNumber(this,false);
      bVar1 = consumeIf(this,'_');
      if (bVar1) {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::ClosureTypeName,(anonymous_namespace)::NodeArray&,StringView&>
                                     ((Db *)this,(NodeArray *)&SwapParams.OriginalValue,
                                      (StringView *)local_b8);
      }
      else {
        this_local = (Db *)0x0;
      }
LAB_002657ee:
      SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)local_70);
    }
    else {
      this_local = (Db *)0x0;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseUnnamedTypeName(NameState *) {
  if (consumeIf("Ut")) {
    StringView Count = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<UnnamedTypeName>(Count);
  }
  if (consumeIf("Ul")) {
    NodeArray Params;
    SwapAndRestore<bool> SwapParams(ParsingLambdaParams, true);
    if (!consumeIf("vE")) {
      size_t ParamsBegin = Names.size();
      do {
        Node *P = parseType();
        if (P == nullptr)
          return nullptr;
        Names.push_back(P);
      } while (!consumeIf('E'));
      Params = popTrailingNodeArray(ParamsBegin);
    }
    StringView Count = parseNumber();
    if (!consumeIf('_'))
      return nullptr;
    return make<ClosureTypeName>(Params, Count);
  }
  return nullptr;
}